

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O2

void order_unassigned(sat_solver2 *s,int v)

{
  if (s->orderpos[v] != -1) {
    return;
  }
  s->orderpos[v] = (s->order).size;
  veci_push(&s->order,v);
  order_update(s,v);
  return;
}

Assistant:

static inline void order_unassigned(sat_solver* s, int v) // undoorder
{
    int* orderpos = s->orderpos;
    if (orderpos[v] == -1){
        orderpos[v] = veci_size(&s->order);
        veci_push(&s->order,v);
        order_update(s,v);
//printf( "+%d ", v );
    }
}